

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CColorConverter.cpp
# Opt level: O0

void irr::video::CColorConverter::convert_viaFormat
               (void *sP,ECOLOR_FORMAT sF,s32 sN,void *dP,ECOLOR_FORMAT dF)

{
  void *dP_00;
  void *in_RCX;
  s32 in_EDX;
  undefined4 in_ESI;
  void *in_RDI;
  uint in_R8D;
  undefined8 in_stack_ffffffffffffffb8;
  s32 sN_00;
  void *in_stack_ffffffffffffffc0;
  void *in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffe0;
  
  sN_00 = (s32)((ulong)in_stack_ffffffffffffffb8 >> 0x20);
  switch(in_ESI) {
  case 0:
    dP_00 = (void *)(ulong)in_R8D;
    switch(dP_00) {
    case (void *)0x0:
      convert_A1R5G5B5toA1R5G5B5(in_stack_ffffffffffffffc0,sN_00,(void *)0x372a7a);
      break;
    case (void *)0x1:
      convert_A1R5G5B5toR5G6B5((void *)CONCAT44(in_R8D,in_stack_ffffffffffffffe0),0,dP_00);
      break;
    case (void *)0x2:
      convert_A1R5G5B5toR8G8B8(in_RDI,in_EDX,in_RCX);
      break;
    case (void *)0x3:
      convert_A1R5G5B5toA8R8G8B8((void *)CONCAT44(in_R8D,in_stack_ffffffffffffffe0),0,dP_00);
    }
    break;
  case 1:
    switch(in_R8D) {
    case 0:
      convert_R5G6B5toA1R5G5B5
                ((void *)CONCAT44(in_R8D,in_stack_ffffffffffffffe0),0,in_stack_ffffffffffffffd0);
      break;
    case 1:
      convert_R5G6B5toR5G6B5(in_stack_ffffffffffffffc0,sN_00,(void *)0x372b0e);
      break;
    case 2:
      convert_R5G6B5toR8G8B8(in_RDI,in_EDX,in_RCX);
      break;
    case 3:
      convert_R5G6B5toA8R8G8B8
                ((void *)CONCAT44(in_R8D,in_stack_ffffffffffffffe0),0,in_stack_ffffffffffffffd0);
    }
    break;
  case 2:
    switch(in_R8D) {
    case 0:
      convert_R8G8B8toA1R5G5B5(in_RDI,in_EDX,in_RCX);
      break;
    case 1:
      convert_R8G8B8toR5G6B5(in_RDI,in_EDX,in_RCX);
      break;
    case 2:
      convert_R8G8B8toR8G8B8(in_stack_ffffffffffffffc0,0,(void *)0x372c31);
      break;
    case 3:
      convert_R8G8B8toA8R8G8B8(in_RDI,in_EDX,in_RCX);
    }
    break;
  case 3:
    switch((void *)(ulong)in_R8D) {
    case (void *)0x0:
      convert_A8R8G8B8toA1R5G5B5
                ((void *)CONCAT44(in_R8D,in_stack_ffffffffffffffe0),0,in_stack_ffffffffffffffd0);
      break;
    case (void *)0x1:
      convert_A8R8G8B8toR5G6B5(in_RDI,in_EDX,in_RCX);
      break;
    case (void *)0x2:
      convert_A8R8G8B8toR8G8B8(in_RDI,in_EDX,in_RCX);
      break;
    case (void *)0x3:
      convert_A8R8G8B8toA8R8G8B8((void *)(ulong)in_R8D,sN_00,(void *)0x372ba2);
    }
  }
  return;
}

Assistant:

void CColorConverter::convert_viaFormat(const void *sP, ECOLOR_FORMAT sF, s32 sN,
		void *dP, ECOLOR_FORMAT dF)
{
	// please also update can_convert_viaFormat when adding new conversions
	switch (sF) {
	case ECF_A1R5G5B5:
		switch (dF) {
		case ECF_A1R5G5B5:
			convert_A1R5G5B5toA1R5G5B5(sP, sN, dP);
			break;
		case ECF_R5G6B5:
			convert_A1R5G5B5toR5G6B5(sP, sN, dP);
			break;
		case ECF_A8R8G8B8:
			convert_A1R5G5B5toA8R8G8B8(sP, sN, dP);
			break;
		case ECF_R8G8B8:
			convert_A1R5G5B5toR8G8B8(sP, sN, dP);
			break;

		default:
			break;
		}
		break;
	case ECF_R5G6B5:
		switch (dF) {
		case ECF_A1R5G5B5:
			convert_R5G6B5toA1R5G5B5(sP, sN, dP);
			break;
		case ECF_R5G6B5:
			convert_R5G6B5toR5G6B5(sP, sN, dP);
			break;
		case ECF_A8R8G8B8:
			convert_R5G6B5toA8R8G8B8(sP, sN, dP);
			break;
		case ECF_R8G8B8:
			convert_R5G6B5toR8G8B8(sP, sN, dP);
			break;

		default:
			break;
		}
		break;
	case ECF_A8R8G8B8:
		switch (dF) {
		case ECF_A1R5G5B5:
			convert_A8R8G8B8toA1R5G5B5(sP, sN, dP);
			break;
		case ECF_R5G6B5:
			convert_A8R8G8B8toR5G6B5(sP, sN, dP);
			break;
		case ECF_A8R8G8B8:
			convert_A8R8G8B8toA8R8G8B8(sP, sN, dP);
			break;
		case ECF_R8G8B8:
			convert_A8R8G8B8toR8G8B8(sP, sN, dP);
			break;

		default:
			break;
		}
		break;
	case ECF_R8G8B8:
		switch (dF) {
		case ECF_A1R5G5B5:
			convert_R8G8B8toA1R5G5B5(sP, sN, dP);
			break;
		case ECF_R5G6B5:
			convert_R8G8B8toR5G6B5(sP, sN, dP);
			break;
		case ECF_A8R8G8B8:
			convert_R8G8B8toA8R8G8B8(sP, sN, dP);
			break;
		case ECF_R8G8B8:
			convert_R8G8B8toR8G8B8(sP, sN, dP);
			break;

		default:
			break;
		}
		break;

	default:
		break;
	}
}